

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLLibraryEffectsLoader15.cpp
# Opt level: O1

void __thiscall
COLLADASaxFWL::LibraryEffectsLoader15::data__wrap_t____fx_sampler_wrap_enum
          (LibraryEffectsLoader15 *this)

{
  _func_int **pp_Var1;
  int in_ESI;
  undefined4 uVar2;
  
  uVar2 = 1;
  if (in_ESI - 1U < 6) {
    uVar2 = *(undefined4 *)(&DAT_00865238 + (ulong)(in_ESI - 1U) * 4);
  }
  pp_Var1 = (this->super_LibraryImagesLoader15).super_IParserImpl15.super_ColladaParserAutoGen15.
            _vptr_ColladaParserAutoGen15;
  (**(code **)(*pp_Var1 + 400))(pp_Var1,uVar2);
  return;
}

Assistant:

bool LibraryEffectsLoader15::data__wrap_t____fx_sampler_wrap_enum( const COLLADASaxFWL15::ENUM__fx_sampler_wrap_enum value )
{
SaxVirtualFunctionTest15(data__wrap_t____fx_sampler_wrap_enum(value));
COLLADASaxFWL::ENUM__fx_sampler_wrap_common newValue;
switch (value) {
case COLLADASaxFWL15::ENUM__fx_sampler_wrap_enum__WRAP: newValue=COLLADASaxFWL::ENUM__fx_sampler_wrap_common__WRAP; break;
case COLLADASaxFWL15::ENUM__fx_sampler_wrap_enum__CLAMP: newValue=COLLADASaxFWL::ENUM__fx_sampler_wrap_common__CLAMP; break;
case COLLADASaxFWL15::ENUM__fx_sampler_wrap_enum__BORDER: newValue=COLLADASaxFWL::ENUM__fx_sampler_wrap_common__BORDER; break;
case COLLADASaxFWL15::ENUM__fx_sampler_wrap_enum__MIRROR: newValue=COLLADASaxFWL::ENUM__fx_sampler_wrap_common__MIRROR; break;
case COLLADASaxFWL15::ENUM__fx_sampler_wrap_enum__MIRROR_ONCE: newValue=COLLADASaxFWL::ENUM__fx_sampler_wrap_common__MIRROR_ONCE; break;
case COLLADASaxFWL15::ENUM__fx_sampler_wrap_enum__COUNT: newValue=COLLADASaxFWL::ENUM__fx_sampler_wrap_common__COUNT; break;
case COLLADASaxFWL15::ENUM__fx_sampler_wrap_enum__NOT_PRESENT: newValue=COLLADASaxFWL::ENUM__fx_sampler_wrap_common__NOT_PRESENT; break;
}
return mLoader->data__wrap_t____fx_sampler_wrap_common(newValue);
}